

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_mtfsf(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i32 arg3;
  TCGv_i64 dst;
  uint uVar2;
  int32_t val;
  uintptr_t o;
  uintptr_t o_1;
  
  if (ctx->fpu_enabled == false) {
    gen_exception(ctx,7);
    return;
  }
  uVar1 = ctx->opcode;
  uVar2 = uVar1 >> 0x10 & 1;
  if (uVar2 == 0 || (ctx->insns_flags2 & 0x20) != 0) {
    tcg_ctx = ctx->uc->tcg_ctx;
    gen_reset_fpstatus(tcg_ctx);
    if ((uVar1 >> 0x19 & 1) == 0) {
      val = (uVar1 >> 0x11 & 0xff) << (sbyte)(uVar2 << 3);
    }
    else {
      val = 0xffff;
      if ((ctx->insns_flags2 & 0x20) == 0) {
        val = 0xff;
      }
    }
    arg3 = tcg_const_i32_ppc64(tcg_ctx,val);
    dst = tcg_temp_new_i64(tcg_ctx);
    get_fpr(tcg_ctx,dst,ctx->opcode >> 0xb & 0x1f);
    gen_helper_store_fpscr(tcg_ctx,tcg_ctx->cpu_env,dst,arg3);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg3 + (long)tcg_ctx));
    if ((ctx->opcode & 1) != 0) {
      tcg_gen_extrl_i64_i32_ppc64(tcg_ctx,cpu_crf[1],cpu_fpscr);
      tcg_gen_shri_i32_ppc64(tcg_ctx,cpu_crf[1],cpu_crf[1],0x1c);
    }
    gen_helper_float_check_status(tcg_ctx,tcg_ctx->cpu_env);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
    return;
  }
  gen_inval_exception(ctx,1);
  return;
}

Assistant:

static void gen_mtfsf(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0;
    TCGv_i64 t1;
    int flm, l, w;

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    flm = FPFLM(ctx->opcode);
    l = FPL(ctx->opcode);
    w = FPW(ctx->opcode);
    if (unlikely(w & !(ctx->insns_flags2 & PPC2_ISA205))) {
        gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        return;
    }
    gen_reset_fpstatus(tcg_ctx);
    if (l) {
        t0 = tcg_const_i32(tcg_ctx, (ctx->insns_flags2 & PPC2_ISA205) ? 0xffff : 0xff);
    } else {
        t0 = tcg_const_i32(tcg_ctx, flm << (w * 8));
    }
    t1 = tcg_temp_new_i64(tcg_ctx);
    get_fpr(tcg_ctx, t1, rB(ctx->opcode));
    gen_helper_store_fpscr(tcg_ctx, tcg_ctx->cpu_env, t1, t0);
    tcg_temp_free_i32(tcg_ctx, t0);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        tcg_gen_trunc_tl_i32(tcg_ctx, cpu_crf[1], cpu_fpscr);
        tcg_gen_shri_i32(tcg_ctx, cpu_crf[1], cpu_crf[1], FPSCR_OX);
    }
    /* We can raise a deferred exception */
    gen_helper_float_check_status(tcg_ctx, tcg_ctx->cpu_env);
    tcg_temp_free_i64(tcg_ctx, t1);
}